

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O1

target_ulong_conflict
helper_precr_sra_r_ph_w_mipsel(uint32_t sa,target_ulong_conflict rs,target_ulong_conflict rt)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  
  if (sa == 0) {
    uVar2 = rt * 2;
    uVar3 = rs * 2;
  }
  else {
    bVar1 = (char)sa - 1;
    uVar2 = ((int)rt >> (bVar1 & 0x1f)) + 1;
    uVar3 = ((int)rs >> (bVar1 & 0x1f)) + 1;
  }
  return uVar3 >> 1 & 0xffff | (uVar2 & 0xfffffffe) << 0xf;
}

Assistant:

target_ulong helper_precr_sra_r_ph_w(uint32_t sa,
                                     target_ulong rs, target_ulong rt)
{
    uint64_t tempB, tempA;

    /* If sa = 0, then (sa - 1) = -1 will case shift error, so we need else. */
    if (sa == 0) {
        tempB = (rt & MIPSDSP_LO) << 1;
        tempA = (rs & MIPSDSP_LO) << 1;
    } else {
        tempB = ((int32_t)rt >> (sa - 1)) + 1;
        tempA = ((int32_t)rs >> (sa - 1)) + 1;
    }
    rt = (((tempB >> 1) & MIPSDSP_LO) << 16) | ((tempA >> 1) & MIPSDSP_LO);

    return (target_long)(int32_t)rt;
}